

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_generic_init_half_route_key.c
# Opt level: O3

void os_routing_generic_init_half_os_route_key(netaddr *ipany,netaddr *specific,netaddr *source)

{
  undefined8 uVar1;
  uint8_t uVar2;
  netaddr *pnVar3;
  
  uVar2 = source->_prefix_len;
  specific->_type = source->_type;
  specific->_prefix_len = uVar2;
  uVar1 = *(undefined8 *)(source->_addr + 8);
  *(undefined8 *)specific->_addr = *(undefined8 *)source->_addr;
  *(undefined8 *)(specific->_addr + 8) = uVar1;
  if (source->_type == '\n') {
    pnVar3 = &NETADDR_IPV6_ANY;
  }
  else {
    if (source->_type != '\x02') {
      ipany->_addr[0] = '\0';
      ipany->_addr[1] = '\0';
      ipany->_addr[2] = '\0';
      ipany->_addr[3] = '\0';
      ipany->_addr[4] = '\0';
      ipany->_addr[5] = '\0';
      ipany->_addr[6] = '\0';
      ipany->_addr[7] = '\0';
      ipany->_addr[8] = '\0';
      ipany->_addr[9] = '\0';
      ipany->_addr[10] = '\0';
      ipany->_addr[0xb] = '\0';
      ipany->_addr[0xc] = '\0';
      ipany->_addr[0xd] = '\0';
      ipany->_addr[0xe] = '\0';
      ipany->_addr[0xf] = '\0';
      ipany->_type = '\0';
      ipany->_prefix_len = '\0';
      return;
    }
    pnVar3 = &NETADDR_IPV4_ANY;
  }
  uVar2 = pnVar3->_prefix_len;
  ipany->_type = pnVar3->_type;
  ipany->_prefix_len = uVar2;
  uVar1 = *(undefined8 *)(pnVar3->_addr + 8);
  *(undefined8 *)ipany->_addr = *(undefined8 *)pnVar3->_addr;
  *(undefined8 *)(ipany->_addr + 8) = uVar1;
  return;
}

Assistant:

void
os_routing_generic_init_half_os_route_key(
  struct netaddr *ipany, struct netaddr *specific, const struct netaddr *source) {
  memcpy(specific, source, sizeof(*source));
  switch (netaddr_get_address_family(source)) {
    case AF_INET:
      memcpy(ipany, &NETADDR_IPV4_ANY, sizeof(struct netaddr));
      break;
    case AF_INET6:
      memcpy(ipany, &NETADDR_IPV6_ANY, sizeof(struct netaddr));
      break;
    default:
      netaddr_invalidate(ipany);
      break;
  }
}